

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heightmap.c
# Opt level: O1

GLuint make_shader_program(char *vertex_shader_src,char *fragment_shader_src)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  char *shader_src;
  GLsizei log_length;
  GLint program_ok;
  char info_log [8192];
  GLsizei local_2030;
  int local_202c;
  GLchar local_2028 [8192];
  
  shader_src = 
  "#version 150\nuniform mat4 project;\nuniform mat4 modelview;\nin float x;\nin float y;\nin float z;\n\nvoid main()\n{\n   gl_Position = project * modelview * vec4(x, y, z, 1.0);\n}\n"
  ;
  if (vertex_shader_src != (char *)0x0) {
    shader_src = vertex_shader_src;
  }
  GVar1 = make_shader(0x8b31,shader_src);
  if (GVar1 == 0) {
    make_shader_program_cold_2();
  }
  else {
    GVar2 = make_shader(0x8b30,
                        "#version 150\nout vec4 gl_FragColor;\nvoid main()\n{\n    gl_FragColor = vec4(0.2, 1.0, 0.2, 1.0); \n}\n"
                       );
    if (GVar2 == 0) {
      make_shader_program_cold_1();
    }
    else {
      GVar3 = (*pglCreateProgram)();
      if (GVar3 != 0) {
        (*pglAttachShader)(GVar3,GVar1);
        (*pglAttachShader)(GVar3,GVar2);
        (*pglLinkProgram)(GVar3);
        (*pglGetProgramiv)(GVar3,0x8b82,&local_202c);
        if (local_202c == 1) {
          return GVar3;
        }
        fwrite("ERROR, failed to link shader program\n",0x25,1,_stderr);
        (*pglGetProgramInfoLog)(GVar3,0x2000,&local_2030,local_2028);
        fprintf(_stderr,"ERROR: \n%s\n\n",local_2028);
        (*pglDeleteProgram)(GVar3);
        (*pglDeleteShader)(GVar2);
        (*pglDeleteShader)(GVar1);
      }
    }
  }
  return 0;
}

Assistant:

static GLuint make_shader_program(const char* vertex_shader_src, const char* fragment_shader_src)
{
    GLuint program = 0u;
    GLint program_ok;
    GLuint vertex_shader = 0u;
    GLuint fragment_shader = 0u;
    GLsizei log_length;
    char info_log[8192];

    vertex_shader = make_shader(GL_VERTEX_SHADER, (vertex_shader_src == NULL) ? default_vertex_shader : vertex_shader_src);
    if (vertex_shader != 0u)
    {
        fragment_shader = make_shader(GL_FRAGMENT_SHADER, (fragment_shader_src == NULL) ? default_fragment_shader : fragment_shader_src);
        if (fragment_shader != 0u)
        {
            /* make the program that connect the two shader and link it */
            program = pglCreateProgram();
            if (program != 0u)
            {
                /* attach both shader and link */
                pglAttachShader(program, vertex_shader);
                pglAttachShader(program, fragment_shader);
                pglLinkProgram(program);
                pglGetProgramiv(program, GL_LINK_STATUS, &program_ok);

                if (program_ok != GL_TRUE)
                {
                    fprintf(stderr, "ERROR, failed to link shader program\n");
                    pglGetProgramInfoLog(program, 8192, &log_length, info_log);
                    fprintf(stderr, "ERROR: \n%s\n\n", info_log);
                    pglDeleteProgram(program);
                    pglDeleteShader(fragment_shader);
                    pglDeleteShader(vertex_shader);
                    program = 0u;
                }
            }
        }
        else
        {
            fprintf(stderr, "ERROR: Unable to load fragment shader\n");
            pglDeleteShader(vertex_shader);
        }
    }
    else
    {
        fprintf(stderr, "ERROR: Unable to load vertex shader\n");
    }
    return program;
}